

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::AddLanguageFlagsForLinking
          (cmLocalGenerator *this,string *flags,cmGeneratorTarget *target,string *lang,
          string *config)

{
  cmMakefile *this_00;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string *local_30;
  string *config_local;
  string *lang_local;
  cmGeneratorTarget *target_local;
  string *flags_local;
  cmLocalGenerator *this_local;
  
  this_00 = this->Makefile;
  local_30 = config;
  config_local = lang;
  lang_local = (string *)target;
  target_local = (cmGeneratorTarget *)flags;
  flags_local = (string *)this;
  std::operator+(&local_70,"CMAKE_",lang);
  std::operator+(&local_50,&local_70,"_LINK_WITH_STANDARD_COMPILE_OPTION");
  bVar1 = cmMakefile::IsOn(this_00,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  if (bVar1) {
    AddCompilerRequirementFlag
              (this,(string *)target_local,(cmGeneratorTarget *)lang_local,config_local,local_30);
  }
  AddLanguageFlags(this,(string *)target_local,(cmGeneratorTarget *)lang_local,Link,config_local,
                   local_30);
  bVar1 = cmGeneratorTarget::IsIPOEnabled((cmGeneratorTarget *)lang_local,config_local,local_30);
  if (bVar1) {
    AppendFeatureOptions(this,(string *)target_local,config_local,"IPO");
  }
  return;
}

Assistant:

void cmLocalGenerator::AddLanguageFlagsForLinking(
  std::string& flags, cmGeneratorTarget const* target, const std::string& lang,
  const std::string& config)
{
  if (this->Makefile->IsOn("CMAKE_" + lang +
                           "_LINK_WITH_STANDARD_COMPILE_OPTION")) {
    // This toolchain requires use of the language standard flag
    // when linking in order to use the matching standard library.
    // FIXME: If CMake gains an abstraction for standard library
    // selection, this will have to be reconciled with it.
    this->AddCompilerRequirementFlag(flags, target, lang, config);
  }

  this->AddLanguageFlags(flags, target, cmBuildStep::Link, lang, config);

  if (target->IsIPOEnabled(lang, config)) {
    this->AppendFeatureOptions(flags, lang, "IPO");
  }
}